

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

PropertyString * __thiscall
Js::ScriptContext::GetPropertyString(ScriptContext *this,PropertyRecord *propertyRecord)

{
  PropertyId propertyId;
  PropertyString *pPVar1;
  
  propertyId = propertyRecord->pid;
  pPVar1 = TryGetProperty<Js::PropertyString>(this,propertyId);
  if (pPVar1 != (PropertyString *)0x0) {
    return pPVar1;
  }
  if (propertyRecord == (PropertyRecord *)0x0) {
    propertyRecord = ThreadContext::GetPropertyName(this->threadContext,propertyId);
  }
  pPVar1 = CreateAndCacheSymbolOrPropertyString<Js::PropertyString>(this,propertyRecord);
  return pPVar1;
}

Assistant:

PropertyString* ScriptContext::GetPropertyString(const PropertyRecord* propertyRecord)
    {
        return this->GetProperty<PropertyString>(propertyRecord->GetPropertyId(), propertyRecord);
    }